

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O0

void destroy_drawbridge(int x,int y)

{
  bool bVar1;
  schar sVar2;
  boolean bVar3;
  byte bVar4;
  uint uVar5;
  obj *obj;
  char *pcVar6;
  int iVar7;
  schar local_5c;
  int local_58;
  int where;
  obj *otmp;
  entity *etmp2;
  entity *etmp1;
  int iStack_30;
  boolean e_inview;
  int db_u;
  int y2;
  int x2;
  trap *t;
  rm *loc2;
  rm *loc1;
  int y_local;
  int x_local;
  
  loc2 = level->locations[x] + y;
  if ((loc2->typ != '\x14') && (loc2->typ != '$')) {
    return;
  }
  iStack_30 = y;
  db_u = x;
  loc1._0_4_ = y;
  loc1._4_4_ = x;
  get_wall_for_db(&db_u,&stack0xffffffffffffffd0);
  t = (trap *)(level->locations[db_u] + iStack_30);
  uVar5 = *(uint *)&loc2->field_0x6 >> 4 & 0x1c;
  if (((uVar5 == 0) || (uVar5 == 4)) || (uVar5 == 0x10)) {
    if (uVar5 == 4) {
      local_58 = 0;
    }
    else {
      local_58 = 2;
      if (uVar5 == 0) {
        local_58 = 1;
      }
    }
    if (loc2->typ == '\x14') {
      if ((viz_array[iStack_30][db_u] & 2U) == 0) {
        if (flags.soundok != '\0') {
          You_hear("a loud *SPLASH*!");
        }
      }
      else {
        pline("The portcullis of the drawbridge falls into the %s!",
              destroy_drawbridge::wstr[local_58]);
      }
    }
    else if ((viz_array[(int)loc1][loc1._4_4_] & 2U) == 0) {
      if (flags.soundok != '\0') {
        You_hear("a loud *SPLASH*!");
      }
    }
    else {
      pline("The drawbridge collapses into the %s!",destroy_drawbridge::wstr[local_58]);
    }
    if (local_58 == 0) {
      local_5c = '\x15';
    }
    else {
      local_5c = '#';
      if (local_58 == 1) {
        local_5c = '\x12';
      }
    }
    loc2->typ = local_5c;
    *(uint *)&loc2->field_0x6 = *(uint *)&loc2->field_0x6 & 0xfffffe0f;
    obj = sobj_at(0x214,level,loc1._4_4_,(int)loc1);
    if (obj != (obj *)0x0) {
      obj_extract_self(obj);
      flooreffects(obj,loc1._4_4_,(int)loc1,"fall");
    }
  }
  else {
    if ((viz_array[(int)loc1][loc1._4_4_] & 2U) == 0) {
      You_hear("a loud *CRASH*!");
    }
    else {
      pline("The drawbridge disintegrates!");
    }
    sVar2 = '\x19';
    if ((*(uint *)&loc2->field_0x6 >> 4 & 8) != 0) {
      sVar2 = '\"';
    }
    loc2->typ = sVar2;
    iVar7 = 0;
    if ((*(uint *)&loc2->field_0x6 >> 4 & 8) != 0) {
      iVar7 = 0x10;
    }
    *(uint *)&loc2->field_0x6 = *(uint *)&loc2->field_0x6 & 0xfffffe0f | iVar7 << 4;
  }
  wake_nearto(loc1._4_4_,(int)loc1,500);
  *(undefined1 *)((long)&t->ntrap + 4) = 0x17;
  *(uint *)((long)&t->ntrap + 6) = *(uint *)((long)&t->ntrap + 6) & 0xfffffe0f;
  _y2 = t_at(level,loc1._4_4_,(int)loc1);
  if (_y2 != (trap *)0x0) {
    deltrap(level,_y2);
  }
  _y2 = t_at(level,db_u,iStack_30);
  if (_y2 != (trap *)0x0) {
    deltrap(level,_y2);
  }
  newsym(loc1._4_4_,(int)loc1);
  newsym(db_u,iStack_30);
  bVar3 = does_block(level,db_u,iStack_30,(monst *)0x0);
  if (bVar3 == '\0') {
    unblock_point(db_u,iStack_30);
  }
  bVar3 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
  if (bVar3 != '\0') {
    u.uevent._0_2_ = u.uevent._0_2_ & 0xfeff | 0x100;
  }
  set_entity(db_u,iStack_30,occupants + 1);
  if (occupants[1].edata != (permonst *)0x0) {
    if (occupants[1].emon == &youmonst) {
      bVar1 = true;
    }
    else {
      if ((occupants[1].emon)->wormno == '\0') {
        if ((viz_array[(occupants[1].emon)->my][(occupants[1].emon)->mx] & 2U) == 0) {
          if (((((u.uprops[0x1e].intrinsic != 0) ||
                ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
               (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
              ((bVar1 = false, ublindf == (obj *)0x0 ||
               (bVar1 = false, ublindf->oartifact != '\x1d')))) ||
             (((u.uprops[0x40].intrinsic == 0 &&
               ((u.uprops[0x40].extrinsic == 0 &&
                (bVar1 = false, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
              (bVar1 = false, ((occupants[1].emon)->data->mflags3 & 0x200) == 0))))
          goto LAB_001798ef;
          bVar4 = viz_array[(occupants[1].emon)->my][(occupants[1].emon)->mx] & 1;
          goto joined_r0x00179828;
        }
      }
      else {
        bVar4 = worm_known(level,occupants[1].emon);
joined_r0x00179828:
        bVar1 = false;
        if (bVar4 == 0) goto LAB_001798ef;
      }
      if ((((((*(uint *)&(occupants[1].emon)->field_0x60 >> 1 & 1) == 0) ||
            (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
          (bVar1 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         (bVar1 = false, (*(uint *)&(occupants[1].emon)->field_0x60 >> 7 & 1) == 0)) {
        bVar1 = (*(uint *)&(occupants[1].emon)->field_0x60 >> 9 & 1) == 0 &&
                ((byte)u._1052_1_ >> 5 & 1) == 0;
      }
    }
LAB_001798ef:
    bVar3 = automiss(occupants + 1);
    if (bVar3 == '\0') {
      if (bVar1) {
        pcVar6 = E_phrase(occupants + 1,"are");
        pline("%s blown apart by flying debris.",pcVar6);
      }
      killer_format = 0;
      killer = "exploding drawbridge";
      iVar7 = 2;
      if (bVar1) {
        iVar7 = 3;
      }
      e_died(occupants + 1,iVar7,7);
    }
  }
  set_entity(loc1._4_4_,(int)loc1,occupants);
  if (occupants[0].edata == (permonst *)0x0) {
    return;
  }
  if (occupants[0].emon == &youmonst) {
    bVar1 = true;
    goto LAB_00179bf8;
  }
  if ((occupants[0].emon)->wormno == '\0') {
    if ((viz_array[(occupants[0].emon)->my][(occupants[0].emon)->mx] & 2U) == 0) {
      if (((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
          ((bVar1 = false, ublindf == (obj *)0x0 || (bVar1 = false, ublindf->oartifact != '\x1d'))))
         || (((u.uprops[0x40].intrinsic == 0 &&
              ((u.uprops[0x40].extrinsic == 0 &&
               (bVar1 = false, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
             (bVar1 = false, ((occupants[0].emon)->data->mflags3 & 0x200) == 0))))
      goto LAB_00179bf8;
      bVar4 = viz_array[(occupants[0].emon)->my][(occupants[0].emon)->mx] & 1;
      goto joined_r0x00179b31;
    }
  }
  else {
    bVar4 = worm_known(level,occupants[0].emon);
joined_r0x00179b31:
    bVar1 = false;
    if (bVar4 == 0) goto LAB_00179bf8;
  }
  if ((((((*(uint *)&(occupants[0].emon)->field_0x60 >> 1 & 1) == 0) ||
        (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) ||
      (bVar1 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     (bVar1 = false, (*(uint *)&(occupants[0].emon)->field_0x60 >> 7 & 1) == 0)) {
    bVar1 = (*(uint *)&(occupants[0].emon)->field_0x60 >> 9 & 1) == 0 &&
            ((byte)u._1052_1_ >> 5 & 1) == 0;
  }
LAB_00179bf8:
  bVar3 = e_missed(occupants,'\x01');
  if (bVar3 == '\0') {
    if (bVar1) {
      if (((occupants[0].emon == &youmonst) || (u.uprops[0x23].intrinsic == 0)) ||
         ((u.uprops[0x24].extrinsic != 0 ||
          ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))))) {
        pcVar6 = E_phrase(occupants,"are");
        pline("%s hit by a huge chunk of metal!",pcVar6);
      }
      else {
        pcVar6 = E_phrase(occupants,"get");
        pline("%s into some heavy metal!",pcVar6);
      }
    }
    else if (((flags.soundok != '\0') && (occupants[0].emon != &youmonst)) &&
            (bVar3 = is_pool(level,loc1._4_4_,(int)loc1), bVar3 == '\0')) {
      You_hear("a crushing sound.");
    }
    killer_format = 0;
    killer = "collapsing drawbridge";
    iVar7 = 2;
    if (bVar1) {
      iVar7 = 3;
    }
    e_died(occupants,iVar7,7);
    if (loc2->typ == '\x12') {
      do_entity(occupants);
    }
  }
  return;
}

Assistant:

void destroy_drawbridge(int x, int y)
{
	struct rm *loc1, *loc2;
	struct trap *t;
	int x2, y2;
	int db_u;
	boolean e_inview;
	struct entity *etmp1 = &(occupants[0]), *etmp2 = &(occupants[1]);

	loc1 = &level->locations[x][y];
	if (!IS_DRAWBRIDGE(loc1->typ))
		return;
	x2 = x; y2 = y;
	get_wall_for_db(&x2,&y2);
	loc2 = &level->locations[x2][y2];
	db_u = (loc1->drawbridgemask & DB_UNDER);
	if (db_u == DB_MOAT || db_u == DB_LAVA || db_u == DB_BOG) {
		struct obj *otmp;
		int where = (db_u == DB_LAVA) ? 0 :
			    (db_u == DB_MOAT) ? 1 : 2;
		static char *wstr[3] = { "lava", "moat", "swamp" };
		if (loc1->typ == DRAWBRIDGE_UP) {
			if (cansee(x2,y2))
			    pline("The portcullis of the drawbridge falls into the %s!",
				  wstr[where]);
			else if (flags.soundok)
				You_hear("a loud *SPLASH*!");
		} else {
			if (cansee(x,y))
			    pline("The drawbridge collapses into the %s!",
				  wstr[where]);
			else if (flags.soundok)
				You_hear("a loud *SPLASH*!");
		}
		loc1->typ = (where == 0) ? LAVAPOOL :
			    (where == 1) ? MOAT : BOG;
		loc1->drawbridgemask = 0;
		if ((otmp = sobj_at(BOULDER, level, x,y)) != 0) {
		    obj_extract_self(otmp);
		    flooreffects(otmp,x,y,"fall");
		}
	} else {
		if (cansee(x,y))
			pline("The drawbridge disintegrates!");
		else
			You_hear("a loud *CRASH*!");
		loc1->typ =
			((loc1->drawbridgemask & DB_ICE) ? ICE : ROOM);
		loc1->icedpool =
			((loc1->drawbridgemask & DB_ICE) ? ICED_MOAT : 0);
	}
	wake_nearto(x, y, 500);
	loc2->typ = DOOR;
	loc2->doormask = D_NODOOR;
	if ((t = t_at(level, x, y)) != 0) deltrap(level, t);
	if ((t = t_at(level, x2, y2)) != 0) deltrap(level, t);
	newsym(x,y);
	newsym(x2,y2);
	if (!does_block(level, x2, y2, NULL)) unblock_point(x2,y2); /* vision */
	if (Is_stronghold(&u.uz)) u.uevent.uopened_dbridge = TRUE;

	set_entity(x2, y2, etmp2); /* currently only automissers can be here */
	if (etmp2->edata) {
		e_inview = e_canseemon(level, etmp2);
		if (!automiss(etmp2)) {
			if (e_inview)
				pline("%s blown apart by flying debris.",
				      E_phrase(etmp2, "are"));
			killer_format = KILLED_BY_AN;
			killer = "exploding drawbridge";
			e_died(etmp2, e_inview? 3 : 2, CRUSHING); /*no corpse*/
		}	     /* nothing which is vulnerable can survive this */
	}
	set_entity(x, y, etmp1);
	if (etmp1->edata) {
		e_inview = e_canseemon(level, etmp1);
		if (!e_missed(etmp1, TRUE)) {
			if (e_inview) {
			    if (!is_u(etmp1) && Hallucination)
				pline("%s into some heavy metal!",
				      E_phrase(etmp1, "get"));
			    else
				pline("%s hit by a huge chunk of metal!",
				      E_phrase(etmp1, "are"));
			} else {
			    if (flags.soundok && !is_u(etmp1) && !is_pool(level, x,y))
				You_hear("a crushing sound.");
			}
			killer_format = KILLED_BY_AN;
			killer = "collapsing drawbridge";
			e_died(etmp1, e_inview? 3 : 2, CRUSHING); /*no corpse*/
			if (loc1->typ == MOAT) do_entity(etmp1);
		}
	}
}